

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O1

void __thiscall
cmMakefileProfilingData::StartEntry
          (cmMakefileProfilingData *this,cmListFileFunction *lff,cmListFileContext *lfc)

{
  element_type *peVar1;
  pointer pcVar2;
  pointer pcVar3;
  ValueHolder VVar4;
  ulong uVar5;
  uint uVar6;
  Value *pVVar7;
  ulong uVar8;
  const_iterator __end2;
  uint __len;
  const_iterator __begin2;
  pointer pcVar9;
  ulong __val;
  bool bVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string __str;
  string args;
  optional<Json::Value> argsValue;
  ValueHolder local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  pointer local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_158;
  size_type local_150;
  long *local_148;
  long *local_140;
  undefined8 local_138;
  long local_130 [2];
  String local_120;
  cmListFileContext *local_f0;
  cmListFileFunction *local_e8;
  cmMakefileProfilingData *local_e0;
  string local_d8;
  Value local_b8;
  char local_90;
  ValueHolder local_88 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  optional<Json::Value> local_60;
  
  local_e0 = this;
  Json::Value::Value(&local_b8,objectValue);
  local_90 = '\x01';
  peVar1 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar9 = (peVar1->Arguments).
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = *(pointer *)
            ((long)&(peVar1->Arguments).
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data + 8);
  local_e8 = lff;
  if (pcVar9 != pcVar2) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    local_f0 = lfc;
    do {
      local_160 = (pointer)(ulong)(local_120._M_string_length != 0);
      paStack_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x81ca45;
      if (local_120._M_string_length != 0) {
        paStack_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x7bf60a;
      }
      local_170.int_ = local_120._M_string_length;
      local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p;
      local_148 = (long *)(pcVar9->Value)._M_dataplus._M_p;
      local_150 = (pcVar9->Value)._M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)&local_170;
      cmCatViews_abi_cxx11_((string *)local_88,views);
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_88[0].bool_);
      if (local_88[0] != &local_78) {
        operator_delete(local_88[0].string_,local_78._M_allocated_capacity + 1);
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar2);
    Json::Value::Value((Value *)&local_170,&local_120);
    pVVar7 = Json::Value::operator[](&local_b8,"functionArgs");
    lfc = local_f0;
    Json::Value::operator=(pVVar7,(Value *)&local_170);
    Json::Value::~Value((Value *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar3 = (lfc->FilePath)._M_dataplus._M_p;
  VVar4 = (ValueHolder)(lfc->FilePath)._M_string_length;
  local_120._M_string_length = (size_type)&local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)0x1;
  local_120.field_2._M_local_buf[0] = ':';
  uVar5 = lfc->Line;
  __val = -uVar5;
  if (0 < (long)uVar5) {
    __val = uVar5;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = __val;
    uVar6 = 4;
    do {
      __len = uVar6;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_001c3e60;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_001c3e60;
      }
      if (uVar8 < 10000) goto LAB_001c3e60;
      bVar10 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      uVar6 = __len + 4;
    } while (bVar10);
    __len = __len + 1;
  }
LAB_001c3e60:
  local_140 = local_130;
  std::__cxx11::string::_M_construct((ulong)&local_140,(char)__len - (char)((long)uVar5 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_140 - ((long)uVar5 >> 0x3f)),__len,__val);
  local_160 = local_120._M_dataplus._M_p;
  paStack_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_string_length;
  local_150 = local_138;
  local_148 = local_140;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_170;
  local_170 = VVar4;
  local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3;
  cmCatViews_abi_cxx11_(&local_d8,views_00);
  Json::Value::Value((Value *)local_88,&local_d8);
  pVVar7 = Json::Value::operator[](&local_b8,"location");
  Json::Value::operator=(pVVar7,(Value *)local_88);
  Json::Value::~Value((Value *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != local_130) {
    operator_delete(local_140,local_130[0] + 1);
  }
  local_170.string_ = (char *)&local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"script","");
  peVar1 = (local_e8->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_60.super__Optional_base<Json::Value,_false,_false>._M_payload.
  super__Optional_payload<Json::Value,_true,_false,_false>.super__Optional_payload_base<Json::Value>
  ._M_engaged = false;
  bVar10 = local_90 == '\x01';
  if (bVar10) {
    Json::Value::Value((Value *)&local_60,&local_b8);
  }
  local_60.super__Optional_base<Json::Value,_false,_false>._M_payload.
  super__Optional_payload<Json::Value,_true,_false,_false>.super__Optional_payload_base<Json::Value>
  ._M_engaged = bVar10;
  StartEntry(local_e0,(string *)&local_170,&peVar1->LowerCaseName,&local_60);
  if (local_60.super__Optional_base<Json::Value,_false,_false>._M_payload.
      super__Optional_payload<Json::Value,_true,_false,_false>.
      super__Optional_payload_base<Json::Value>._M_engaged == true) {
    local_60.super__Optional_base<Json::Value,_false,_false>._M_payload.
    super__Optional_payload<Json::Value,_true,_false,_false>.
    super__Optional_payload_base<Json::Value>._M_engaged = false;
    Json::Value::~Value((Value *)&local_60);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170.string_,(ulong)(local_160 + 1));
  }
  if (local_90 == '\x01') {
    local_90 = 0;
    Json::Value::~Value(&local_b8);
  }
  return;
}

Assistant:

void cmMakefileProfilingData::StartEntry(const cmListFileFunction& lff,
                                         cmListFileContext const& lfc)
{
  cm::optional<Json::Value> argsValue(cm::in_place, Json::objectValue);
  if (!lff.Arguments().empty()) {
    std::string args;
    for (auto const& a : lff.Arguments()) {
      args = cmStrCat(args, args.empty() ? "" : " ", a.Value);
    }
    (*argsValue)["functionArgs"] = args;
  }
  (*argsValue)["location"] =
    cmStrCat(lfc.FilePath, ':', std::to_string(lfc.Line));
  this->StartEntry("script", lff.LowerCaseName(), std::move(argsValue));
}